

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O3

adiak_datatype_t *
adiak::internal::
parse<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>
::make_type(void)

{
  adiak_numerical_t aVar1;
  adiak_datatype_t *paVar2;
  adiak_datatype_t **ppaVar3;
  adiak_datatype_t *paVar4;
  
  paVar2 = (adiak_datatype_t *)calloc(1,0x20);
  paVar2->dtype = adiak_tuple;
  aVar1 = adiak_numerical_from_type(adiak_tuple);
  paVar2->numerical = aVar1;
  paVar2->num_elements = 2;
  paVar2->num_subtypes = 2;
  ppaVar3 = (adiak_datatype_t **)malloc(0x10);
  paVar2->subtype = ppaVar3;
  paVar4 = adiak_get_basetype(adiak_ulonglong);
  ppaVar3[1] = paVar4;
  paVar4 = adiak_get_basetype(adiak_string);
  *ppaVar3 = paVar4;
  return paVar2;
}

Assistant:

static adiak_datatype_t *make_type() {
            adiak_datatype_t *datatype = (adiak_datatype_t *) malloc(sizeof(adiak_datatype_t));
            const size_t N = std::tuple_size<std::tuple<Ts...> >::value;
            memset(datatype, 0, sizeof(*datatype));
            datatype->dtype = adiak_tuple;
            datatype->numerical = adiak_numerical_from_type(datatype->dtype);
            datatype->num_elements = N;
            datatype->num_subtypes = N;
            datatype->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *) * N);
            set_tuple_type<std::tuple<Ts...>, N>::settype(datatype->subtype);
            return datatype;            
         }